

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackInterpreter.cpp
# Opt level: O3

void __thiscall Lodtalk::StackInterpreter::backwardJump(StackInterpreter *this,int delta)

{
  size_t sVar1;
  bool bVar2;
  
  sVar1 = this->pc;
  this->pc = sVar1 + 1 + (long)delta;
  this->nextOpcode =
       (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                              super_SequenceableCollection.super_Collection.super_Object.
                              super_ProtoObject.object_header_ + sVar1 + (long)delta);
  bVar2 = VMContext::garbageCollectionSafePoint(this->context);
  if (bVar2) {
    fetchFrameData(this);
    return;
  }
  return;
}

Assistant:

void backwardJump(int delta)
    {
        pc += delta;
        fetchNextInstructionOpcode();

        if(garbageCollectionSafePoint())
            fetchFrameData();
    }